

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket.cpp
# Opt level: O0

bool __thiscall blc::network::Socket::waitWrite(Socket *this,uint usec)

{
  int iVar1;
  uint in_ESI;
  long in_RDI;
  fd_set *__arr;
  uint __i;
  timeval timeout;
  fd_set fds;
  uint local_ac;
  timeval local_a8;
  fd_set local_98;
  
  local_a8.tv_sec = 0;
  local_a8.tv_usec = (__suseconds_t)in_ESI;
  for (local_ac = 0; local_ac < 0x10; local_ac = local_ac + 1) {
    local_98.fds_bits[local_ac] = 0;
  }
  iVar1 = *(int *)(in_RDI + 8) / 0x40;
  local_98.fds_bits[iVar1] =
       1L << ((byte)((long)*(int *)(in_RDI + 8) % 0x40) & 0x3f) | local_98.fds_bits[iVar1];
  iVar1 = select(*(int *)(in_RDI + 8) + 1,(fd_set *)0x0,&local_98,(fd_set *)0x0,&local_a8);
  return 0 < iVar1;
}

Assistant:

bool blc::network::Socket::waitWrite(unsigned int usec) const {
	fd_set fds;
	#ifdef __WIN32
		struct timeval timeout = {0, static_cast<int32_t>(usec)};
	#elif __APPLE__
		struct timeval timeout = {0, static_cast<int32_t>(usec)};
	#else
		struct timeval timeout = {0, reinterpret_cast<unsigned int>(usec)};
	#endif

	FD_ZERO(&fds);
	FD_SET(this->_socket, &fds);
	if (select(this->_socket + 1, 0, &fds, 0, &timeout) <= 0)
		return (false);
	return (true);
}